

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::ast::Expression*>::emplace_back<slang::ast::Expression*const&>
          (SmallVectorBase<slang::ast::Expression_*> *this,Expression **args)

{
  iterator ppEVar1;
  undefined8 *in_RSI;
  SmallVectorBase<slang::ast::Expression_*> *in_RDI;
  Expression **in_stack_00000020;
  pointer in_stack_00000028;
  SmallVectorBase<slang::ast::Expression_*> *in_stack_00000030;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    SmallVectorBase<slang::ast::Expression_*>::end(in_RDI);
    local_8 = emplaceRealloc<slang::ast::Expression*const&>
                        (in_stack_00000030,in_stack_00000028,in_stack_00000020);
  }
  else {
    ppEVar1 = SmallVectorBase<slang::ast::Expression_*>::end(in_RDI);
    *ppEVar1 = (Expression *)*in_RSI;
    in_RDI->len = in_RDI->len + 1;
    local_8 = SmallVectorBase<slang::ast::Expression_*>::back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }